

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

StringBuilder * __thiscall Potassco::StringBuilder::append(StringBuilder *this,size_t n,char c)

{
  Type TVar1;
  char *pcVar2;
  unsigned_long *puVar3;
  byte in_DL;
  char in_SIL;
  StringBuilder *__ptr;
  StringBuilder *in_RDI;
  Buffer buf;
  size_t in_stack_00000058;
  StringBuilder *in_stack_00000060;
  unsigned_long local_38;
  Buffer local_30;
  byte local_11;
  size_t local_10 [2];
  
  local_11 = in_DL;
  local_10[0]._0_1_ = in_SIL;
  TVar1 = type((StringBuilder *)0x140343);
  if (TVar1 == Str) {
    std::__cxx11::string::append((ulong)(in_RDI->field_0).str_,(char)local_10[0]);
  }
  else {
    __ptr = in_RDI;
    grow(in_stack_00000060,in_stack_00000058);
    pcVar2 = Buffer::pos(&local_30);
    Buffer::free(&local_30,__ptr);
    puVar3 = std::min<unsigned_long>(local_10,&local_38);
    local_10[0] = *puVar3;
    memset(pcVar2,(uint)local_11,local_10[0]);
    pcVar2 = Buffer::pos(&local_30);
    pcVar2[local_10[0]] = '\0';
  }
  return in_RDI;
}

Assistant:

StringBuilder& StringBuilder::append(std::size_t n, char c) {
	if (type() == Str) {
		str_->append(n, c);
	}
	else {
		Buffer buf = grow(n);
		std::memset(buf.pos(), static_cast<int>(c), n = std::min(n, buf.free()));
		buf.pos()[n] = 0;
	}
	return *this;
}